

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

bool deqp::gles3::Functional::verifyConstantDerivate
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Vec4 *reference,Vec4 *threshold,Vec4 *scale,Vec4 *bias,
               VerificationLogging logPolicy)

{
  ostringstream *poVar1;
  bool bVar2;
  float fVar3;
  int y;
  int x;
  int local_234;
  BVec4 mask;
  LogVecComps local_218;
  Vec4 *local_208;
  ConstPixelBufferAccess *local_200;
  PixelBufferAccess *local_1f8;
  LogVecComps local_1f0;
  Vec4 resDerivate;
  Vector<float,_4> local_1d0;
  Vec4 local_1c0;
  MessageBuilder local_1b0;
  
  local_208 = threshold;
  local_1f8 = errorMask;
  fVar3 = (float)glu::getDataTypeFloatScalars(dataType);
  switch(dataType) {
  case TYPE_FLOAT:
    local_1b0.m_log = (TestLog *)CONCAT44(local_1b0.m_log._4_4_,1);
    break;
  case TYPE_FLOAT_VEC2:
    local_1b0.m_log = (TestLog *)CONCAT44(local_1b0.m_log._4_4_,0x101);
    break;
  case TYPE_FLOAT_VEC3:
    local_1b0.m_log = (TestLog *)CONCAT44(local_1b0.m_log._4_4_,0x10101);
    break;
  case TYPE_FLOAT_VEC4:
    local_1b0.m_log = (TestLog *)CONCAT44(local_1b0.m_log._4_4_,0x1010101);
    break;
  default:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&local_1b0,true);
  }
  tcu::logicalNot<bool,4>((tcu *)&mask,(Vector<bool,_4> *)&local_1b0);
  if (logPolicy == LOG_ALL) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Expecting ");
    resDerivate.m_data._0_8_ = reference;
    resDerivate.m_data[2] = fVar3;
    tcu::MessageBuilder::operator<<(&local_1b0,(LogVecComps *)&resDerivate);
    std::operator<<((ostream *)poVar1," with threshold ");
    local_218.v = local_208;
    local_218.numComps = (int)fVar3;
    tcu::MessageBuilder::operator<<(&local_1b0,&local_218);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  local_234 = 0;
  local_200 = result;
  for (y = 0; y < (result->m_size).m_data[1]; y = y + 1) {
    for (x = 0; x < (result->m_size).m_data[0]; x = x + 1) {
      readDerivate((Functional *)&resDerivate,result,scale,bias,x,y);
      tcu::operator-((tcu *)&local_218,reference,(Vector<float,_4> *)&resDerivate);
      tcu::abs<float,4>((tcu *)&local_1b0,(Vector<float,_4> *)&local_218);
      tcu::lessThanEqual<float,4>((tcu *)&local_1c0,(Vector<float,_4> *)&local_1b0,local_208);
      tcu::logicalOr<bool,4>((tcu *)&local_1f0,(Vector<bool,_4> *)&local_1c0,&mask);
      tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&local_1d0,true);
      bVar2 = tcu::allEqual<bool,4>((Vector<bool,_4> *)&local_1f0,(Vector<bool,_4> *)&local_1d0);
      if (!bVar2) {
        if (local_234 < 10 && logPolicy == LOG_ALL) {
          local_1b0.m_log = log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
          std::operator<<((ostream *)&local_1b0.m_str,"FAIL: got ");
          local_218.v = &resDerivate;
          local_218.numComps = (int)fVar3;
          tcu::MessageBuilder::operator<<(&local_1b0,&local_218);
          std::operator<<((ostream *)&local_1b0.m_str,", diff = ");
          tcu::operator-((tcu *)&local_1d0,reference,&resDerivate);
          tcu::abs<float,4>((tcu *)&local_1c0,&local_1d0);
          local_1f0.v = &local_1c0;
          local_1f0.numComps = (int)fVar3;
          tcu::MessageBuilder::operator<<(&local_1b0,&local_1f0);
          std::operator<<((ostream *)&local_1b0.m_str,", at x = ");
          std::ostream::operator<<(&local_1b0.m_str,x);
          std::operator<<((ostream *)&local_1b0.m_str,", y = ");
          std::ostream::operator<<(&local_1b0.m_str,y);
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
          result = local_200;
        }
        local_234 = local_234 + 1;
        local_218.v = (Vec4 *)CONCAT44(local_218.v._4_4_,0xff0000ff);
        tcu::RGBA::toVec((RGBA *)&local_218);
        tcu::PixelBufferAccess::setPixel(local_1f8,(Vec4 *)&local_1b0,x,y,0);
      }
    }
  }
  if (logPolicy == LOG_ALL && 9 < local_234) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"...");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  if (0 < local_234 && logPolicy == LOG_ALL) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"FAIL: found ");
    std::ostream::operator<<(poVar1,local_234);
    std::operator<<((ostream *)poVar1," failed pixels");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  return local_234 == 0;
}

Assistant:

static bool verifyConstantDerivate (tcu::TestLog&						log,
									const tcu::ConstPixelBufferAccess&	result,
									const tcu::PixelBufferAccess&		errorMask,
									glu::DataType						dataType,
									const tcu::Vec4&					reference,
									const tcu::Vec4&					threshold,
									const tcu::Vec4&					scale,
									const tcu::Vec4&					bias,
									VerificationLogging					logPolicy = LOG_ALL)
{
	const int			numComps		= glu::getDataTypeFloatScalars(dataType);
	const tcu::BVec4	mask			= tcu::logicalNot(getDerivateMask(dataType));
	int					numFailedPixels	= 0;

	if (logPolicy == LOG_ALL)
		log << TestLog::Message << "Expecting " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps) << TestLog::EndMessage;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::Vec4		resDerivate		= readDerivate(result, scale, bias, x, y);
			const bool			isOk			= tcu::allEqual(tcu::logicalOr(tcu::lessThanEqual(tcu::abs(reference - resDerivate), threshold), mask), tcu::BVec4(true));

			if (!isOk)
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
					log << TestLog::Message << "FAIL: got " << LogVecComps(resDerivate, numComps)
											<< ", diff = " << LogVecComps(tcu::abs(reference - resDerivate), numComps)
											<< ", at x = " << x << ", y = " << y
						<< TestLog::EndMessage;
				numFailedPixels += 1;
				errorMask.setPixel(tcu::RGBA::red().toVec(), x, y);
			}
		}
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0 && logPolicy == LOG_ALL)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}